

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O0

void __thiscall SQOuterVar::SQOuterVar(SQOuterVar *this,SQOuterVar *ov)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  SQObjectPtr *this_00;
  SQObjectPtr *in_stack_ffffffffffffffe0;
  
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 2));
  this_00 = (SQObjectPtr *)(in_RDI + 6);
  ::SQObjectPtr::SQObjectPtr(this_00);
  *in_RDI = *in_RSI;
  ::SQObjectPtr::operator=(in_stack_ffffffffffffffe0,this_00);
  ::SQObjectPtr::operator=(in_stack_ffffffffffffffe0,this_00);
  return;
}

Assistant:

SQOuterVar(const SQOuterVar &ov)
    {
        _type=ov._type;
        _src=ov._src;
        _name=ov._name;
    }